

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileMonitor.cxx
# Opt level: O2

string * __thiscall
cmRootDirectoryWatcher::Path_abi_cxx11_(string *__return_storage_ptr__,cmRootDirectoryWatcher *this)

{
  std::__cxx11::string::string
            ((string *)__return_storage_ptr__,
             (string *)&(this->super_cmRealDirectoryWatcher).PathSegment);
  return __return_storage_ptr__;
}

Assistant:

std::string Path() const final { return this->PathSegment; }